

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SwapChainVkImpl::RecreateVulkanSwapchain
          (SwapChainVkImpl *this,DeviceContextVkImpl *pImmediateCtxVk)

{
  PFN_vkDestroySwapchainKHR p_Var1;
  VkResult VVar2;
  RenderDeviceVkImpl *this_00;
  VulkanPhysicalDevice *this_01;
  VkDevice pVVar3;
  undefined1 local_5c [4];
  VkResult err;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  VkPhysicalDevice vkDeviceHandle;
  RenderDeviceVkImpl *pDeviceVk;
  DeviceContextVkImpl *pImmediateCtxVk_local;
  SwapChainVkImpl *this_local;
  
  ReleaseSwapChainResources(this,pImmediateCtxVk,false);
  this_00 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                      (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  this_01 = RenderDeviceVkImpl::GetPhysicalDevice(this_00);
  surfCapabilities._44_8_ = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle(this_01);
  VVar2 = (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                    ((VkPhysicalDevice)surfCapabilities._44_8_,this->m_VkSurface,
                     (VkSurfaceCapabilitiesKHR *)local_5c);
  p_Var1 = vkDestroySwapchainKHR;
  if (VVar2 == VK_ERROR_SURFACE_LOST_KHR) {
    if (this->m_VkSwapChain != (VkSwapchainKHR)0x0) {
      pVVar3 = RenderDeviceVkImpl::GetVkDevice(this_00);
      (*p_Var1)(pVVar3,this->m_VkSwapChain,(VkAllocationCallbacks *)0x0);
      this->m_VkSwapChain = (VkSwapchainKHR)0x0;
    }
    CreateSurface(this);
  }
  CreateVulkanSwapChain(this);
  InitBuffersAndViews(this);
  return;
}

Assistant:

void SwapChainVkImpl::RecreateVulkanSwapchain(DeviceContextVkImpl* pImmediateCtxVk)
{
    // Do not destroy Vulkan swap chain as we will use it as oldSwapchain parameter.
    ReleaseSwapChainResources(pImmediateCtxVk, /*DestroyVkSwapChain*/ false);

    // Check if the surface is lost
    {
        RenderDeviceVkImpl*    pDeviceVk      = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
        const VkPhysicalDevice vkDeviceHandle = pDeviceVk->GetPhysicalDevice().GetVkDeviceHandle();

        VkSurfaceCapabilitiesKHR surfCapabilities;
        // Call vkGetPhysicalDeviceSurfaceCapabilitiesKHR only to check the return code
        VkResult err = vkGetPhysicalDeviceSurfaceCapabilitiesKHR(vkDeviceHandle, m_VkSurface, &surfCapabilities);
        if (err == VK_ERROR_SURFACE_LOST_KHR)
        {
            // Destroy the swap chain associated with the surface
            if (m_VkSwapChain != VK_NULL_HANDLE)
            {
                vkDestroySwapchainKHR(pDeviceVk->GetVkDevice(), m_VkSwapChain, NULL);
                m_VkSwapChain = VK_NULL_HANDLE;
            }

            // Recreate the surface
            CreateSurface();
        }
    }

    CreateVulkanSwapChain();
    InitBuffersAndViews();
}